

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  int line;
  TimeInMillis ms;
  int i;
  pointer pcVar4;
  char *pcVar5;
  internal *this;
  string summary;
  string location;
  int local_b8;
  allocator<char> local_b1;
  ostream *local_b0;
  int local_a4;
  string local_a0;
  TestResult *local_80;
  string detail;
  string kTestcase;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestcase,"testcase",(allocator<char> *)&location);
  if (test_info->is_in_another_shard_ != false) goto LAB_0045038b;
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"name",(allocator<char> *)&detail);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&summary,(test_info->name_)._M_dataplus._M_p,(allocator<char> *)&local_a0);
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"value_param",(allocator<char> *)&detail);
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&summary,pcVar4,(allocator<char> *)&local_a0);
    OutputXmlAttribute(stream,&kTestcase,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"type_param",(allocator<char> *)&detail);
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&summary,pcVar4,(allocator<char> *)&local_a0);
    OutputXmlAttribute(stream,&kTestcase,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"file",(allocator<char> *)&detail);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&summary,(test_info->location_).file._M_dataplus._M_p,
               (allocator<char> *)&local_a0);
    OutputXmlAttribute(stream,&kTestcase,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&location,"line",(allocator<char> *)&local_a0);
    detail._M_dataplus._M_p._0_4_ = (test_info->location_).line;
    StreamableToString<int>(&summary,(int *)&detail);
    OutputXmlAttribute(stream,&kTestcase,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
    std::operator<<(stream," />\n");
    goto LAB_0045038b;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"status",(allocator<char> *)&detail);
  pcVar5 = "notrun";
  if (test_info->should_run_ != false) {
    pcVar5 = "run";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&summary,pcVar5,(allocator<char> *)&local_a0);
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"time",(allocator<char> *)&detail);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&summary,(internal *)(test_info->result_).elapsed_time_,ms)
  ;
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&location,"classname",(allocator<char> *)&detail);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&summary,test_case_name,(allocator<char> *)&local_a0);
  local_b0 = stream;
  OutputXmlAttribute(stream,&kTestcase,&location,&summary);
  local_80 = &test_info->result_;
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  local_b8 = 0;
  i = 0;
  while( true ) {
    poVar3 = local_b0;
    line = 0x70;
    if ((int)(((long)(test_info->result_).test_part_results_.
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(test_info->result_).test_part_results_.
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
    local_a4 = i;
    pTVar2 = TestResult::GetTestPartResult(local_80,i);
    if (pTVar2->type_ != kSuccess) {
      if (local_b8 == 0) {
        std::operator<<(local_b0,">\n");
      }
      this = (internal *)(pTVar2->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,this,(char *)(ulong)(uint)pTVar2->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar2->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&detail);
      poVar3 = std::operator<<(local_b0,"      <failure message=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,summary._M_dataplus._M_p,&local_b1);
      EscapeXmlAttribute(&detail,&local_a0);
      poVar3 = std::operator<<(poVar3,(string *)&detail);
      std::operator<<(poVar3,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&local_a0);
      std::operator+(&local_a0,&location,"\n");
      std::operator+(&detail,&local_a0,(pTVar2->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_a0);
      RemoveInvalidXmlCharacters(&local_a0,&detail);
      poVar3 = local_b0;
      OutputXmlCDataSection(local_b0,local_a0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_a0);
      std::operator<<(poVar3,"</failure>\n");
      local_b8 = local_b8 + 1;
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&summary);
      std::__cxx11::string::~string((string *)&location);
    }
    i = local_a4 + 1;
  }
  if (local_b8 == 0) {
    if ((int)((ulong)((long)(test_info->result_).test_properties_.
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(test_info->result_).test_properties_.
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
      std::operator<<(local_b0,">\n");
      goto LAB_0045036f;
    }
    pcVar5 = " />\n";
  }
  else {
LAB_0045036f:
    OutputXmlTestProperties(poVar3,local_80);
    pcVar5 = "    </testcase>\n";
  }
  std::operator<<(poVar3,pcVar5);
LAB_0045038b:
  std::__cxx11::string::~string((string *)&kTestcase);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestcase, "file", test_info.file());
    OutputXmlAttribute(stream, kTestcase, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}